

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O2

bool adios2::helper::GetParameter<int>(Params *params,string *key,int *value)

{
  int iVar1;
  const_iterator cVar2;
  _Rb_tree_header *p_Var3;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&params->_M_t,key);
  p_Var3 = &(params->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var3) {
    iVar1 = std::__cxx11::stoi((string *)(cVar2._M_node + 2),(size_t *)0x0,10);
    *value = iVar1;
  }
  return (_Rb_tree_header *)cVar2._M_node != p_Var3;
}

Assistant:

bool GetParameter(const Params &params, const std::string &key, int &value)
{
    auto it = params.find(key);
    if (it == params.end())
    {
        return false;
    }
    else
    {
        try
        {
            value = std::stoi(it->second);
        }
        catch (...)
        {
            helper::Throw<std::invalid_argument>("Helper", "adiosString", "GetParameter",
                                                 "Engine parameter " + key +
                                                     " can only be integer numbers");
        }
    }
    return true;
}